

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

void __thiscall
Fad<Fad<double>>::
Fad<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>>,Fad<Fad<double>>>>,FadExpr<FadBinaryMul<Fad<Fad<double>>,Fad<Fad<double>>>>>>,FadExpr<FadBinaryMul<Fad<Fad<double>>,Fad<Fad<double>>>>>>
          (Fad<Fad<double>> *this,
          FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>
          *fadexpr)

{
  double *pdVar1;
  uint uVar2;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>
  *pFVar3;
  FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *pFVar4;
  uint uVar5;
  ulong *puVar6;
  Fad<double> *this_00;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  value_type local_50;
  
  FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>
  ::val((value_type *)(this + 8),&fadexpr->fadexpr_);
  pFVar3 = (fadexpr->fadexpr_).left_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  uVar2 = (((pFVar4->fadexpr_).left_)->dx_).num_elts;
  uVar5 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar5 < (int)uVar2) {
    uVar5 = uVar2;
  }
  pFVar4 = (pFVar3->fadexpr_).right_;
  uVar2 = (((pFVar4->fadexpr_).left_)->dx_).num_elts;
  uVar8 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar8 < (int)uVar2) {
    uVar8 = uVar2;
  }
  if ((int)uVar8 < (int)uVar5) {
    uVar8 = uVar5;
  }
  pFVar4 = (fadexpr->fadexpr_).right_;
  uVar2 = (((pFVar4->fadexpr_).left_)->dx_).num_elts;
  uVar5 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar5 < (int)uVar2) {
    uVar5 = uVar2;
  }
  if ((int)uVar5 < (int)uVar8) {
    uVar5 = uVar8;
  }
  *(undefined4 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  if (0 < (int)uVar5) {
    *(uint *)(this + 0x28) = uVar5;
    lVar10 = (ulong)uVar5 * 0x20;
    puVar6 = (ulong *)operator_new__(lVar10 + 8);
    *puVar6 = (ulong)uVar5;
    lVar9 = 0;
    this_00 = (Fad<double> *)(puVar6 + 1);
    do {
      Fad<double>::Fad(this_00);
      lVar9 = lVar9 + -0x20;
      this_00 = this_00 + 1;
    } while (-lVar9 != lVar10);
    *(Fad<double> **)(this + 0x30) = (Fad<double> *)(puVar6 + 1);
  }
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined4 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  pFVar3 = (fadexpr->fadexpr_).left_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  uVar2 = (((pFVar4->fadexpr_).left_)->dx_).num_elts;
  uVar5 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar5 < (int)uVar2) {
    uVar5 = uVar2;
  }
  pFVar4 = (pFVar3->fadexpr_).right_;
  uVar2 = (((pFVar4->fadexpr_).left_)->dx_).num_elts;
  uVar8 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar8 < (int)uVar2) {
    uVar8 = uVar2;
  }
  if ((int)uVar8 < (int)uVar5) {
    uVar8 = uVar5;
  }
  pFVar4 = (fadexpr->fadexpr_).right_;
  uVar2 = (((pFVar4->fadexpr_).left_)->dx_).num_elts;
  uVar5 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar5 < (int)uVar2) {
    uVar5 = uVar2;
  }
  if ((int)uVar5 < (int)uVar8) {
    uVar5 = uVar8;
  }
  if (0 < (int)uVar5) {
    lVar9 = 0;
    uVar7 = 0;
    do {
      FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>
      ::dx(&local_50,&fadexpr->fadexpr_,(int)uVar7);
      lVar10 = *(long *)(this + 0x30);
      pdVar1 = (double *)(lVar9 + lVar10);
      *pdVar1 = local_50.val_;
      Vector<double>::operator=((Vector<double> *)(pdVar1 + 1),&local_50.dx_);
      *(double *)(lVar10 + 0x18 + lVar9) = local_50.defaultVal;
      Fad<double>::~Fad(&local_50);
      uVar7 = uVar7 + 1;
      lVar9 = lVar9 + 0x20;
    } while (uVar5 != uVar7);
  }
  return;
}

Assistant:

inline Fad(const FadExpr<ExprT>& fadexpr) : 
    val_(fadexpr.val()), 
    dx_(fadexpr.size()), 
    defaultVal(T(0))
    {
      int sz = fadexpr.size();

      if ( sz ) {
        for(int i=0; i<sz; ++i) 
          dx_[i] = fadexpr.dx(i);
      }
    }